

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy_to_ucol.c
# Opt level: O2

int ccopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,singlecomplex *dense,
                 GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int_t iVar4;
  int_t *piVar5;
  int_t *piVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int next;
  void *pvVar10;
  int_t nzumax;
  int local_9c;
  int local_98;
  int local_94;
  int_t *local_90;
  long local_88;
  int_t *local_80;
  int *local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  singlecomplex *local_50;
  long local_48;
  int_t *local_40;
  ulong local_38;
  
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  local_90 = Glu->lsub;
  local_40 = Glu->xlsub;
  pvVar10 = Glu->ucol;
  piVar5 = Glu->usub;
  local_80 = Glu->xusub;
  nzumax = Glu->nzumax;
  local_48 = (long)nseg;
  local_38 = 0;
  local_94 = 0;
  if (0 < nseg) {
    local_94 = nseg;
  }
  local_88 = (long)jcol;
  local_98 = piVar9[local_88];
  next = local_80[local_88];
  local_78 = piVar9;
  local_70 = piVar8;
  local_68 = segrep;
  local_60 = repfnz;
  local_58 = perm_r;
  local_50 = dense;
  do {
    if ((int)local_38 == local_94) {
      local_80[local_88 + 1] = next;
      return 0;
    }
    local_48 = local_48 + -1;
    iVar1 = segrep[local_48];
    if ((piVar9[iVar1] != local_98) && (iVar2 = repfnz[iVar1], iVar2 != -1)) {
      local_9c = (iVar2 - piVar8[piVar9[iVar1]]) + local_40[piVar8[piVar9[iVar1]]];
      piVar6 = local_90;
      while (nzumax < next + (iVar1 - iVar2) + 1) {
        iVar4 = cLUMemXpand(jcol,next,UCOL,&nzumax,Glu);
        if (iVar4 != 0) {
          return iVar4;
        }
        pvVar10 = Glu->ucol;
        iVar4 = cLUMemXpand(jcol,next,USUB,&nzumax,Glu);
        if (iVar4 != 0) {
          return iVar4;
        }
        piVar6 = Glu->lsub;
        piVar5 = Glu->usub;
      }
      for (lVar7 = 0; (int)lVar7 <= iVar1 - iVar2; lVar7 = lVar7 + 1) {
        iVar3 = piVar6[local_9c + lVar7];
        piVar5[next + lVar7] = local_58[iVar3];
        *(singlecomplex *)((long)pvVar10 + lVar7 * 8 + (long)next * 8) = local_50[iVar3];
        local_50[iVar3].r = 0.0;
        local_50[iVar3].i = 0.0;
      }
      next = next + (int)lVar7;
      repfnz = local_60;
      segrep = local_68;
      piVar8 = local_70;
      piVar9 = local_78;
      local_90 = piVar6;
    }
    local_38 = (ulong)((int)local_38 + 1);
  } while( true );
}

Assistant:

int
ccopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      singlecomplex     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    singlecomplex    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    singlecomplex zero = {0.0, 0.0};

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (singlecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = cLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (singlecomplex *) Glu->ucol;
		    mem_error = cLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}